

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O1

void __thiscall
test_adjacency_graph_size_undirected_Test::~test_adjacency_graph_size_undirected_Test
          (test_adjacency_graph_size_undirected_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, size_undirected) {
  Adjacency_Graph<false> graph;
  EXPECT_EQ(graph.size_vertex(), 0);
  EXPECT_EQ(graph.size_edge(), 0);
  EXPECT_EQ(graph.size().first, std::make_pair(0, 0).first);
  EXPECT_EQ(graph.size().second, std::make_pair(0, 0).second);

  graph.insert(std::make_pair(0, 1));
  EXPECT_EQ(graph.size_vertex(), 2);
  EXPECT_EQ(graph.size_edge(), 1);
  EXPECT_EQ(graph.size().first, std::make_pair(2, 1).first);
  EXPECT_EQ(graph.size().second, std::make_pair(2, 1).second);

  graph.insert(std::make_pair(1, 2));
  EXPECT_EQ(graph.size_vertex(), 3);
  EXPECT_EQ(graph.size_edge(), 2);
  EXPECT_EQ(graph.size().first, std::make_pair(3, 2).first);
  EXPECT_EQ(graph.size().second, std::make_pair(3, 2).second);

  graph.insert(std::make_pair(5, 6));  // Creates a set of unconnected vertices, total vertices 7.
  EXPECT_EQ(graph.size_vertex(), 7);
  EXPECT_EQ(graph.size_edge(), 3);
  EXPECT_EQ(graph.size().first, std::make_pair(7, 3).first);
  EXPECT_EQ(graph.size().second, std::make_pair(7, 3).second);
}